

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall
SourceMapTest_SourceMappingSingleSegment_Test::~SourceMapTest_SourceMappingSingleSegment_Test
          (SourceMapTest_SourceMappingSingleSegment_Test *this)

{
  SourceMapTest_SourceMappingSingleSegment_Test *this_local;
  
  ~SourceMapTest_SourceMappingSingleSegment_Test(this);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMappingSingleSegment) {
  // A single-segment mapping starting at offset 0.
  std::string sourceMap = R"(
      {
          "version": 3,
          "sources": [],
          "sourcesContent": [],
          "names": [],
          "mappings": "A"
      }
  )";
  parseMap(sourceMap);

  auto loc = reader->readDebugLocationAt(0);
  EXPECT_FALSE(loc.has_value());
}